

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

void Imf_2_5::copyFromDeepFrameBuffer
               (char **writePtr,char *base,char *sampleCountBase,ptrdiff_t sampleCountXStride,
               ptrdiff_t sampleCountYStride,int y,int xMin,int xMax,int xOffsetForSampleCount,
               int yOffsetForSampleCount,int xOffsetForData,int yOffsetForData,
               ptrdiff_t sampleStride,ptrdiff_t dataXStride,ptrdiff_t dataYStride,Format format,
               PixelType type)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  uint *puVar4;
  ArgExc *pAVar5;
  int in_ECX;
  char *in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  size_t j_1;
  int in_stack_00000030;
  uint i_5;
  char *readPtr_5;
  char *ptr_5;
  long in_stack_00000048;
  uint count_5;
  int x_5;
  uint i_4;
  char *readPtr_4;
  char *ptr_4;
  uint count_4;
  int x_4;
  size_t j;
  uint i_3;
  char *readPtr_3;
  char *ptr_3;
  uint count_3;
  int x_3;
  uint i_2;
  char *readPtr_2;
  char *ptr_2;
  uint count_2;
  int x_2;
  uint i_1;
  char *readPtr_1;
  char *ptr_1;
  uint count_1;
  int x_1;
  uint i;
  char *readPtr;
  char *ptr;
  uint count;
  int x;
  undefined4 in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  char **in_stack_fffffffffffffee0;
  ulong local_100;
  uint local_f4;
  char *local_f0;
  int local_d8;
  uint local_d4;
  char *local_d0;
  int local_bc;
  ulong local_b8;
  uint local_ac;
  char *local_a8;
  int local_90;
  uint local_8c;
  int local_74;
  uint local_6c;
  int local_50;
  uint local_4c;
  int local_30;
  
  if (x_5 == 1) {
    if ((int)readPtr_4 == 0) {
      for (local_30 = in_stack_00000008; local_30 <= in_stack_00000010; local_30 = local_30 + 1) {
        puVar4 = (uint *)sampleCount(in_RDX,in_ECX,in_R8D,local_30 - in_stack_00000018,
                                     in_R9D - in_stack_00000020);
        uVar2 = *puVar4;
        for (local_4c = 0; local_4c < uVar2; local_4c = local_4c + 1) {
          Xdr::write<Imf_2_5::CharPtrIO,char*>
                    (in_stack_fffffffffffffee0,(uint)in_stack_fffffffffffffedc);
        }
      }
    }
    else if ((int)readPtr_4 == 1) {
      for (local_50 = in_stack_00000008; local_50 <= in_stack_00000010; local_50 = local_50 + 1) {
        puVar4 = (uint *)sampleCount(in_RDX,in_ECX,in_R8D,local_50 - in_stack_00000018,
                                     in_R9D - in_stack_00000020);
        uVar2 = *puVar4;
        for (local_6c = 0; local_6c < uVar2; local_6c = local_6c + 1) {
          Xdr::write<Imf_2_5::CharPtrIO,char*>
                    ((char **)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                     (half)(unsigned_short)((ulong)in_stack_fffffffffffffee0 >> 0x30));
        }
      }
    }
    else {
      if ((int)readPtr_4 != 2) {
        pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar5,"Unknown pixel data type.");
        __cxa_throw(pAVar5,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      for (local_74 = in_stack_00000008; local_74 <= in_stack_00000010; local_74 = local_74 + 1) {
        puVar4 = (uint *)sampleCount(in_RDX,in_ECX,in_R8D,local_74 - in_stack_00000018,
                                     in_R9D - in_stack_00000020);
        uVar2 = *puVar4;
        for (local_8c = 0; local_8c < uVar2; local_8c = local_8c + 1) {
          Xdr::write<Imf_2_5::CharPtrIO,char*>(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
        }
      }
    }
  }
  else if ((int)readPtr_4 == 0) {
    for (local_90 = in_stack_00000008; local_90 <= in_stack_00000010; local_90 = local_90 + 1) {
      puVar4 = (uint *)sampleCount(in_RDX,in_ECX,in_R8D,local_90 - in_stack_00000018,
                                   in_R9D - in_stack_00000020);
      uVar2 = *puVar4;
      local_a8 = *(char **)(in_RSI + (in_R9D - in_stack_00000030) * in_stack_00000048 +
                           (long)(local_90 - (int)j_1) * (long)ptr_5);
      for (local_ac = 0; local_ac < uVar2; local_ac = local_ac + 1) {
        for (local_b8 = 0; local_b8 < 4; local_b8 = local_b8 + 1) {
          cVar1 = local_a8[local_b8];
          pcVar3 = (char *)*in_RDI;
          *in_RDI = (long)(pcVar3 + 1);
          *pcVar3 = cVar1;
        }
        local_a8 = readPtr_5 + (long)local_a8;
      }
    }
  }
  else if ((int)readPtr_4 == 1) {
    for (local_bc = in_stack_00000008; local_bc <= in_stack_00000010; local_bc = local_bc + 1) {
      puVar4 = (uint *)sampleCount(in_RDX,in_ECX,in_R8D,local_bc - in_stack_00000018,
                                   in_R9D - in_stack_00000020);
      uVar2 = *puVar4;
      local_d0 = *(char **)(in_RSI + (in_R9D - in_stack_00000030) * in_stack_00000048 +
                           (long)(local_bc - (int)j_1) * (long)ptr_5);
      for (local_d4 = 0; local_d4 < uVar2; local_d4 = local_d4 + 1) {
        *(undefined2 *)*in_RDI = *(undefined2 *)local_d0;
        *in_RDI = *in_RDI + 2;
        local_d0 = readPtr_5 + (long)local_d0;
      }
    }
  }
  else {
    if ((int)readPtr_4 != 2) {
      pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar5,"Unknown pixel data type.");
      __cxa_throw(pAVar5,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    for (local_d8 = in_stack_00000008; local_d8 <= in_stack_00000010; local_d8 = local_d8 + 1) {
      puVar4 = (uint *)sampleCount(in_RDX,in_ECX,in_R8D,local_d8 - in_stack_00000018,
                                   in_R9D - in_stack_00000020);
      uVar2 = *puVar4;
      local_f0 = *(char **)(in_RSI + (in_R9D - in_stack_00000030) * in_stack_00000048 +
                           (long)(local_d8 - (int)j_1) * (long)ptr_5);
      for (local_f4 = 0; local_f4 < uVar2; local_f4 = local_f4 + 1) {
        for (local_100 = 0; local_100 < 4; local_100 = local_100 + 1) {
          cVar1 = local_f0[local_100];
          pcVar3 = (char *)*in_RDI;
          *in_RDI = (long)(pcVar3 + 1);
          *pcVar3 = cVar1;
        }
        local_f0 = readPtr_5 + (long)local_f0;
      }
    }
  }
  return;
}

Assistant:

void
copyFromDeepFrameBuffer (char *& writePtr,
                         const char * base,
                         char* sampleCountBase,
                         ptrdiff_t sampleCountXStride,
                         ptrdiff_t sampleCountYStride,
                         int y, int xMin, int xMax,
                         int xOffsetForSampleCount,
                         int yOffsetForSampleCount,
                         int xOffsetForData,
                         int yOffsetForData,
                         ptrdiff_t sampleStride,
                         ptrdiff_t dataXStride,
                         ptrdiff_t dataYStride,
                         Compressor::Format format,
                         PixelType type)
{
    //
    // Copy a horizontal row of pixels from a frame
    // buffer to an output file's line or tile buffer.
    //

    if (format == Compressor::XDR)
    {
        //
        // The the line or tile buffer is in XDR format.
        //

        switch (type)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    Xdr::write <CharPtrIO> (writePtr,
                                            *(const unsigned int *) readPtr);
                    readPtr += sampleStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    Xdr::write <CharPtrIO> (writePtr, *(const half *) readPtr);
                    readPtr += sampleStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;                                   
                                   
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    Xdr::write <CharPtrIO> (writePtr, *(const float *) readPtr);
                    readPtr += sampleStride;
                }
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The the line or tile buffer is in NATIVE format.
        //

        switch (type)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                                   
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;                                                                      
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    for (size_t j = 0; j < sizeof (unsigned int); ++j)
                        *writePtr++ = readPtr[j];

                    readPtr += sampleStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;                                   
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    *(half *) writePtr = *(const half *) readPtr;
                    writePtr += sizeof (half);
                    readPtr += sampleStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                                   
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;                                   
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    for (size_t j = 0; j < sizeof (float); ++j)
                        *writePtr++ = readPtr[j];

                    readPtr += sampleStride;
                }
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
}